

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O2

void __thiscall QEvdevTabletManager::addDevice(QEvdevTabletManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  Data *local_50;
  undefined1 local_48 [28];
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevTablet();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = pQVar1->name;
    local_48._8_4_ = 2;
    local_48._12_8_ = 0;
    local_48._20_8_ = 0;
    local_2c = 0;
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_48 + 8,"Adding device at %ls",uVar2);
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::make_unique<QEvdevTabletHandlerThread,QString_const&,QString&>
            ((QString *)local_48,deviceNode);
  if ((Data *)local_48._0_8_ == (Data *)0x0) {
    local_48._8_4_ = 2;
    local_2c = 0;
    local_48._12_8_ = 0;
    local_48._20_8_ = 0;
    local_28 = "default";
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_48 + 8,"evdevtablet: Failed to open tablet device %ls",uVar2);
  }
  else {
    local_50 = (Data *)local_48._0_8_;
    local_48._0_8_ = (Data *)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::add
              (&this->m_activeDevices,deviceNode,
               (unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
                )&local_50);
    if (local_50 != (Data *)0x0) {
      (**(code **)(*(long *)&local_50->super_QArrayData + 0x20))();
    }
    local_50 = (Data *)0x0;
    updateDeviceCount(this);
  }
  if ((Data *)local_48._0_8_ != (Data *)0x0) {
    (**(code **)(*(long *)(QArrayData *)local_48._0_8_ + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTablet, "Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTabletHandlerThread>(deviceNode, m_spec);
    if (handler) {
        m_activeDevices.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevtablet: Failed to open tablet device %ls", qUtf16Printable(deviceNode));
    }
}